

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall ktx::PrintDiff::operator<<(PrintDiff *this,DiffBase<VkFormat> *diff)

{
  OutputFormat OVar1;
  PrintIndent *pPVar2;
  undefined1 auVar3 [16];
  long *plVar4;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_03;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_04;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_05;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_06;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_07;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_08;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_09;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_10;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_11;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_12;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_13;
  long *local_88;
  size_t sStack_80;
  long local_78 [2];
  long *local_68;
  size_t sStack_60;
  long *local_58;
  size_t sStack_50;
  long *local_48;
  
  if (diff->different == true) {
    this->different = true;
    OVar1 = this->outputFormat;
    if (OVar1 == text) {
      printContext(this);
      if (diff->values[0].super__Optional_base<VkFormat,_true,_true>._M_payload.
          super__Optional_payload_base<VkFormat>._M_engaged == true) {
        pPVar2 = this->printIndent;
        (**diff->_vptr_DiffBase)(&local_88,diff,0,(ulong)this->outputFormat);
        local_58 = (long *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
        local_68 = (long *)0x217ddc;
        format_str_03.size_ = 5;
        format_str_03.data_ = "{:{}}";
        args_03.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_03.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_03,args_03);
        sStack_60 = (diff->textHeader)._M_len;
        local_68 = (long *)(diff->textHeader)._M_str;
        local_58 = local_88;
        sStack_50 = sStack_80;
        format_str_04.size_ = 8;
        format_str_04.data_ = "-{}: {}\n";
        args_04.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_04.desc_ = 0xdd;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_04,args_04);
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
      }
      if (diff->values[1].super__Optional_base<VkFormat,_true,_true>._M_payload.
          super__Optional_payload_base<VkFormat>._M_engaged == true) {
        pPVar2 = this->printIndent;
        (**diff->_vptr_DiffBase)(&local_88,diff,1,(ulong)this->outputFormat);
        local_58 = (long *)(ulong)(uint)(pPVar2->indentBase * pPVar2->indentWidth);
        local_68 = (long *)0x217ddc;
        format_str_05.size_ = 5;
        format_str_05.data_ = "{:{}}";
        args_05.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_05.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_05,args_05);
        sStack_60 = (diff->textHeader)._M_len;
        local_68 = (long *)(diff->textHeader)._M_str;
        local_58 = local_88;
        sStack_50 = sStack_80;
        format_str_06.size_ = 8;
        format_str_06.data_ = "+{}: {}\n";
        args_06.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_06.desc_ = 0xdd;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_06,args_06);
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
      }
    }
    else {
      beginJsonOutput(this);
      pPVar2 = this->printIndent;
      local_58 = (long *)(ulong)(uint)((pPVar2->indentBase + 2) * pPVar2->indentWidth);
      local_68 = (long *)0x217ddc;
      format_str.size_ = 5;
      format_str.data_ = "{:{}}";
      args.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
      args.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str,args);
      sStack_60 = (diff->jsonPath)._M_len;
      local_58 = (long *)0x1fecc1;
      if (OVar1 == json_mini) {
        local_58 = (long *)0x217ddc;
      }
      local_68 = (long *)(diff->jsonPath)._M_str;
      plVar4 = (long *)0x1fcdf2;
      if (OVar1 == json_mini) {
        plVar4 = (long *)0x217ddc;
      }
      format_str_00.size_ = 10;
      format_str_00.data_ = "\"{}\":{}[{}";
      args_00.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
      args_00.desc_ = 0xccd;
      local_48 = plVar4;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_00,args_00);
      pPVar2 = this->printIndent;
      if (diff->values[0].super__Optional_base<VkFormat,_true,_true>._M_payload.
          super__Optional_payload_base<VkFormat>._M_engaged == true) {
        (**diff->_vptr_DiffBase)(&local_88,diff,0,(ulong)this->outputFormat);
        local_58 = (long *)(ulong)(uint)((pPVar2->indentBase + 3) * pPVar2->indentWidth);
        local_68 = (long *)0x217ddc;
        format_str_01.size_ = 5;
        format_str_01.data_ = "{:{}}";
        args_01.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_01.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_01,args_01);
        local_68 = local_88;
        sStack_60 = sStack_80;
        format_str_02.size_ = 5;
        format_str_02.data_ = "{},{}";
        args_02.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_02.desc_ = 0xcd;
        local_58 = plVar4;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_02,args_02);
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
      }
      else {
        local_58 = (long *)(ulong)(uint)((pPVar2->indentBase + 3) * pPVar2->indentWidth);
        local_68 = (long *)0x217ddc;
        format_str_07.size_ = 5;
        format_str_07.data_ = "{:{}}";
        args_07.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_07.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_07,args_07);
        format_str_08.size_ = 7;
        format_str_08.data_ = "null,{}";
        args_08.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_08.desc_ = 0xc;
        local_68 = plVar4;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_08,args_08);
      }
      pPVar2 = this->printIndent;
      if (diff->values[1].super__Optional_base<VkFormat,_true,_true>._M_payload.
          super__Optional_payload_base<VkFormat>._M_engaged == true) {
        (**diff->_vptr_DiffBase)(&local_88,diff,1,(ulong)this->outputFormat);
        local_58 = (long *)(ulong)(uint)((pPVar2->indentBase + 3) * pPVar2->indentWidth);
        local_68 = (long *)0x217ddc;
        format_str_09.size_ = 5;
        format_str_09.data_ = "{:{}}";
        args_09.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_09.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_09,args_09);
        local_68 = local_88;
        sStack_60 = sStack_80;
        format_str_10.size_ = 4;
        format_str_10.data_ = "{}{}";
        args_10.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_10.desc_ = 0xcd;
        local_58 = plVar4;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_10,args_10);
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
      }
      else {
        local_58 = (long *)(ulong)(uint)((pPVar2->indentBase + 3) * pPVar2->indentWidth);
        local_68 = (long *)0x217ddc;
        format_str_11.size_ = 5;
        format_str_11.data_ = "{:{}}";
        args_11.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_11.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_11,args_11);
        format_str_12.size_ = 6;
        format_str_12.data_ = "null{}";
        args_12.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_12.desc_ = 0xc;
        local_68 = plVar4;
        ::fmt::v10::vprint<char>(pPVar2->os,format_str_12,args_12);
      }
      pPVar2 = this->printIndent;
      local_58 = (long *)(ulong)(uint)((pPVar2->indentBase + 2) * pPVar2->indentWidth);
      local_68 = (long *)0x217ddc;
      format_str_13.size_ = 5;
      format_str_13.data_ = "{:{}}";
      args_13.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
      args_13.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(pPVar2->os,format_str_13,args_13);
      format_str_14.size_ = 1;
      format_str_14.data_ = "]";
      auVar3._8_8_ = 0;
      auVar3._0_8_ = &local_68;
      ::fmt::v10::vprint<char>
                (pPVar2->os,format_str_14,
                 (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
                 (auVar3 << 0x40));
    }
  }
  return;
}

Assistant:

void operator<<(const DiffBase<T>& diff) {
        if (!diff.isDifferent()) return;
        different = true;

        const auto space = outputFormat != OutputFormat::json_mini ?  " " : "";
        const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";

        if (outputFormat == OutputFormat::text) {
            printContext();
            if (diff.hasValue(0))
                printIndent(0, "-{}: {}\n", diff.textHeader, diff.value(0, outputFormat));
            if (diff.hasValue(1))
                printIndent(0, "+{}: {}\n", diff.textHeader, diff.value(1, outputFormat));
        } else {
            beginJsonOutput();
            printIndent(2, "\"{}\":{}[{}", diff.jsonPath, space, nl);
            if (diff.hasValue(0))
                printIndent(3, "{},{}", diff.value(0, outputFormat), nl);
            else
                printIndent(3, "null,{}", nl);
            if (diff.hasValue(1))
                printIndent(3, "{}{}", diff.value(1, outputFormat), nl);
            else
                printIndent(3, "null{}", nl);
            printIndent(2, "]");
        }
    }